

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindDegenerates.cpp
# Opt level: O0

ai_real calculateAreaOfTriangle(aiFace *face,aiMesh *mesh)

{
  aiVector3D *paVar1;
  ai_real aVar2;
  ai_real b_00;
  ai_real c_00;
  ai_real c;
  ai_real b;
  ai_real a;
  aiVector3D vC;
  aiVector3D vB;
  aiVector3D vA;
  ai_real area;
  aiMesh *mesh_local;
  aiFace *face_local;
  
  vB.y = mesh->mVertices[*face->mIndices].x;
  vB.z = mesh->mVertices[*face->mIndices].y;
  paVar1 = mesh->mVertices + face->mIndices[1];
  vC.y = paVar1->x;
  vC.z = paVar1->y;
  vB.x = paVar1->z;
  paVar1 = mesh->mVertices + face->mIndices[2];
  b = paVar1->x;
  unique0x00012004 = paVar1->y;
  vC.x = paVar1->z;
  aVar2 = distance3D((aiVector3D *)&vB.y,(aiVector3D *)&vC.y);
  b_00 = distance3D((aiVector3D *)&vC.y,(aiVector3D *)&b);
  c_00 = distance3D((aiVector3D *)&b,(aiVector3D *)&vB.y);
  aVar2 = heron(aVar2,b_00,c_00);
  return aVar2;
}

Assistant:

static ai_real calculateAreaOfTriangle( const aiFace& face, aiMesh* mesh ) {
    ai_real area = 0;

    aiVector3D vA( mesh->mVertices[ face.mIndices[ 0 ] ] );
    aiVector3D vB( mesh->mVertices[ face.mIndices[ 1 ] ] );
    aiVector3D vC( mesh->mVertices[ face.mIndices[ 2 ] ] );

    ai_real a( distance3D( vA, vB ) );
    ai_real b( distance3D( vB, vC ) );
    ai_real c( distance3D( vC, vA ) );
    area = heron( a, b, c );

    return area;
}